

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O1

ostream * operator<<(ostream *lhs,grammar *rhs)

{
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  char cVar3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  strong_t<int,_grammar::token_tag> *symbol;
  _Base_ptr p_Var8;
  strong_t<int,_grammar::token_tag> *tok;
  undefined2 *local_88;
  undefined8 local_80;
  undefined2 local_78;
  undefined6 uStack_76;
  grammar *local_68;
  this_t local_60;
  _Rb_tree_node_base *local_40;
  _Base_ptr local_38;
  
  if (operator<<(std::ostream&,grammar_const&)::column == '\0') {
    operator<<();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (lhs,"Symbol mapping (Negative = terminal):",0x25);
  cVar3 = (char)lhs;
  std::ios::widen((char)*(undefined8 *)(*(long *)lhs + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  local_68 = rhs;
  for (p_Var5 = (rhs->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(rhs->symbols)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    *(long *)(lhs + *(long *)(*(long *)lhs + -0x18) + 0x10) = (long)operator<<::column._M_n;
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)lhs,p_Var5[1]._M_color);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," --> ",5);
    *(long *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = (long)operator<<::column._M_n;
    poVar4 = operator<<(poVar4,(this_t *)&p_Var5[1]._M_parent);
    local_88 = (undefined2 *)CONCAT71(local_88._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_88,1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(lhs,"Rules:",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)lhs + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  p_Var6 = (local_68->rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(local_68->rules)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var6 != local_38) {
    do {
      *(long *)(lhs + *(long *)(*(long *)lhs + -0x18) + 0x10) = (long)operator<<::column._M_n;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)lhs,p_Var6[1]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," --> ",5);
      p_Var2 = p_Var6[1]._M_left;
      local_40 = p_Var6;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var2; p_Var8 = (_Base_ptr)&p_Var8->field_0x4) {
        _Var1 = p_Var8->_M_color;
        if (_Var1 == _S_red) {
          local_88 = (undefined2 *)CONCAT71(local_88._1_7_,0x20);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(lhs,(char *)&local_88,1);
          local_78 = 0x7c;
          local_80 = 1;
          local_60.internal_rep._M_dataplus._M_p = (pointer)&local_60.internal_rep.field_2;
          local_88 = &local_78;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_60,&local_78,(long)&local_78 + 1);
          if (local_88 != &local_78) {
            operator_delete(local_88,CONCAT62(uStack_76,local_78) + 1);
          }
          poVar4 = operator<<(poVar4,&local_60);
          local_88 = (undefined2 *)CONCAT71(local_88._1_7_,0x20);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_88,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60.internal_rep._M_dataplus._M_p != &local_60.internal_rep.field_2) {
            operator_delete(local_60.internal_rep._M_dataplus._M_p,
                            local_60.internal_rep.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          *(long *)(lhs + *(long *)(*(long *)lhs + -0x18) + 0x10) = (long)operator<<::column._M_n;
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)lhs,_Var1);
          local_88 = (undefined2 *)CONCAT71(local_88._1_7_,0x20);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_88,1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)lhs + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(local_40);
    } while (p_Var6 != local_38);
  }
  std::__ostream_insert<char,std::char_traits<char>>(lhs,"Rules Prettified:",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)lhs + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  p_Var6 = (local_68->rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var6 != local_38) {
    do {
      *(long *)(lhs + *(long *)(*(long *)lhs + -0x18) + 0x10) = (long)operator<<::column._M_n;
      pmVar7 = std::
               map<strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>_>
               ::at(&local_68->symbols,(key_type *)(p_Var6 + 1));
      poVar4 = operator<<(lhs,pmVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," --> ",5);
      p_Var2 = p_Var6[1]._M_left;
      local_40 = p_Var6;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var2; p_Var8 = (_Base_ptr)&p_Var8->field_0x4) {
        if (p_Var8->_M_color == _S_red) {
          local_88 = (undefined2 *)CONCAT71(local_88._1_7_,0x20);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(lhs,(char *)&local_88,1);
          local_78 = 0x7c;
          local_80 = 1;
          local_60.internal_rep._M_dataplus._M_p = (pointer)&local_60.internal_rep.field_2;
          local_88 = &local_78;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_60,&local_78,(long)&local_78 + 1);
          if (local_88 != &local_78) {
            operator_delete(local_88,CONCAT62(uStack_76,local_78) + 1);
          }
          poVar4 = operator<<(poVar4,&local_60);
          local_88 = (undefined2 *)CONCAT71(local_88._1_7_,0x20);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_88,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60.internal_rep._M_dataplus._M_p != &local_60.internal_rep.field_2) {
            operator_delete(local_60.internal_rep._M_dataplus._M_p,
                            local_60.internal_rep.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          *(long *)(lhs + *(long *)(*(long *)lhs + -0x18) + 0x10) = (long)operator<<::column._M_n;
          pmVar7 = std::
                   map<strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>_>
                   ::at(&local_68->symbols,(key_type *)p_Var8);
          poVar4 = operator<<(lhs,pmVar7);
          local_88 = (undefined2 *)CONCAT71(local_88._1_7_,0x20);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_88,1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)lhs + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(local_40);
    } while (p_Var6 != local_38);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)lhs + -0x18) + cVar3);
  std::ostream::put(cVar3);
  poVar4 = (ostream *)std::ostream::flush();
  return poVar4;
}

Assistant:

std::ostream & operator<<(std::ostream & lhs, const grammar & rhs) {
    static constexpr auto arrow  = " --> ";
    static const auto     column = std::setw(2);

    lhs << "Symbol mapping (Negative = terminal):" << std::endl;
    for (const auto & entry : rhs.symbols) {
        lhs << column << entry.first << arrow << column << entry.second << '\n';
    }

    lhs << "Rules:" << std::endl;
    for (const auto & entry : rhs.rules) {
        lhs << column << entry.first << arrow;
        for (const auto & symbol : entry.second) {
            if (symbol == grammar::rule_sep)
                lhs << ' ' << grammar::rule_sep_char() << ' ';
            else
                lhs << column << symbol << ' ';
        }
        lhs << std::endl;
    }

    lhs << "Rules Prettified:" << std::endl;
    for (const auto & entry : rhs.rules) {
        lhs << column << rhs.symbols.at(entry.first) << arrow;
        for (const auto & tok : entry.second) {
            if (tok == grammar::rule_sep)
                lhs << ' ' << grammar::rule_sep_char() << ' ';
            else
                lhs << column << rhs.symbols.at(tok) << ' ';
        }
        lhs << std::endl;
    }

    return lhs << std::endl;
}